

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

string * getRootDir_abi_cxx11_(void)

{
  string *in_RDI;
  string *ret;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::operator=((string *)in_RDI,"/");
  return in_RDI;
}

Assistant:

std::string getRootDir()
{
    std::string ret;
#ifdef WIN32
    ret = getEnvironment("SystemDrive");
    if (ret.empty())
        ret = "c:";
    ret.append("/");
#else
    ret = "/";
#endif
    return ret;
}